

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar UVar1;
  UChar UVar2;
  UCPTrie *trie;
  void *pvVar3;
  byte bVar4;
  long lVar5;
  UBool UVar6;
  int iVar7;
  UChar *pUVar8;
  long lVar9;
  ushort uVar10;
  byte bVar11;
  ushort norm16;
  uint c;
  UChar *pUVar12;
  UChar *local_40;
  
  UVar1 = this->minDecompNoCP;
  if (limit == (UChar *)0x0) {
    lVar5 = 0;
    do {
      lVar9 = lVar5;
      if (*(UChar *)((long)src + lVar9) == L'\0') break;
      lVar5 = lVar9 + 2;
    } while ((ushort)*(UChar *)((long)src + lVar9) < (ushort)UVar1);
    pUVar12 = (UChar *)((long)src + lVar9);
    if (buffer != (ReorderingBuffer *)0x0 && lVar9 + 2 != 2) {
      ReorderingBuffer::appendZeroCC(buffer,src,pUVar12,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) {
      return pUVar12;
    }
    limit = u_strchr_63(pUVar12,L'\0');
    src = pUVar12;
  }
  norm16 = 0;
  uVar10 = 0;
  pUVar12 = src;
  do {
    local_40 = pUVar12;
    bVar4 = (byte)uVar10;
LAB_0028cf8a:
    pUVar12 = src;
    if (src == limit) {
      return src;
    }
    do {
      UVar2 = *pUVar12;
      c = (uint)(ushort)UVar2;
      if ((ushort)UVar2 < (ushort)UVar1) {
LAB_0028d03d:
        pUVar8 = pUVar12 + 1;
      }
      else {
        trie = this->normTrie;
        pvVar3 = (trie->data).ptr0;
        norm16 = *(ushort *)
                  ((long)pvVar3 +
                  (ulong)(((ushort)UVar2 & 0x3f) + (uint)trie->index[(ushort)UVar2 >> 6]) * 2);
        uVar10 = this->minYesNo;
        if ((norm16 & 0xfdff) == 0xfc00 || norm16 < uVar10) goto LAB_0028d03d;
        if (((ushort)UVar2 & 0xfc00) != 0xd800) break;
        pUVar8 = pUVar12 + 1;
        if ((pUVar8 != limit) && (((ushort)*pUVar8 & 0xfc00) == 0xdc00)) {
          c = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)*pUVar8 + 0xfca02400;
          if ((int)c < trie->highStart) {
            iVar7 = ucptrie_internalSmallIndex_63(trie,c);
            uVar10 = this->minYesNo;
          }
          else {
            iVar7 = trie->dataLength + -2;
          }
          norm16 = *(ushort *)((long)pvVar3 + (long)iVar7 * 2);
          pUVar8 = pUVar12 + 2;
          if (((norm16 & 0xfdff) != 0xfc00) && (uVar10 <= norm16)) break;
        }
      }
      pUVar12 = pUVar8;
    } while (pUVar8 != limit);
    if (pUVar12 == src) {
      if (src == limit) {
        return pUVar12;
      }
      src = pUVar12 + (2 - (c < 0x10000));
      if (buffer == (ReorderingBuffer *)0x0) goto LAB_0028d15d;
LAB_0028d0f8:
      UVar6 = decompose(this,c,norm16,buffer,errorCode);
      if (UVar6 == '\0') {
        return src;
      }
      goto LAB_0028cf8a;
    }
    if (buffer != (ReorderingBuffer *)0x0) {
      UVar6 = ReorderingBuffer::appendZeroCC(buffer,src,pUVar12,errorCode);
      if (pUVar12 == limit) {
        return pUVar12;
      }
      if (UVar6 == '\0') {
        return pUVar12;
      }
      src = pUVar12 + (2 - (c < 0x10000));
      goto LAB_0028d0f8;
    }
    if (pUVar12 == limit) {
      return pUVar12;
    }
    src = pUVar12 + (2 - (c < 0x10000));
    bVar4 = 0;
    local_40 = pUVar12;
LAB_0028d15d:
    if ((this->minYesNo <= norm16) && (norm16 < this->minMaybeYes)) {
      return local_40;
    }
    uVar10 = norm16 >> 1;
    if (norm16 < 0xfc00) {
      uVar10 = 0;
    }
    bVar11 = (byte)uVar10;
    pUVar12 = local_40;
    if (bVar11 < 2) {
      pUVar12 = src;
    }
    if (bVar11 != 0 && bVar11 < bVar4) {
      return local_40;
    }
  } while( true );
}

Assistant:

const UChar *
Normalizer2Impl::decompose(const UChar *src, const UChar *limit,
                           ReorderingBuffer *buffer,
                           UErrorCode &errorCode) const {
    UChar32 minNoCP=minDecompNoCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        limit=u_strchr(src, 0);
    }

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t norm16=0;

    // only for quick check
    const UChar *prevBoundary=src;
    uint8_t prevCC=0;

    for(;;) {
        // count code units below the minimum or with irrelevant data for the quick check
        for(prevSrc=src; src!=limit;) {
            if( (c=*src)<minNoCP ||
                isMostDecompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else if(!U16_IS_LEAD(c)) {
                break;
            } else {
                UChar c2;
                if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                    c=U16_GET_SUPPLEMENTARY(c, c2);
                    norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                    if(isMostDecompYesAndZeroCC(norm16)) {
                        src+=2;
                    } else {
                        break;
                    }
                } else {
                    ++src;  // unpaired lead surrogate: inert
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL) {
                if(!buffer->appendZeroCC(prevSrc, src, errorCode)) {
                    break;
                }
            } else {
                prevCC=0;
                prevBoundary=src;
            }
        }
        if(src==limit) {
            break;
        }

        // Check one above-minimum, relevant code point.
        src+=U16_LENGTH(c);
        if(buffer!=NULL) {
            if(!decompose(c, norm16, *buffer, errorCode)) {
                break;
            }
        } else {
            if(isDecompYes(norm16)) {
                uint8_t cc=getCCFromYesOrMaybe(norm16);
                if(prevCC<=cc || cc==0) {
                    prevCC=cc;
                    if(cc<=1) {
                        prevBoundary=src;
                    }
                    continue;
                }
            }
            return prevBoundary;  // "no" or cc out of order
        }
    }
    return src;
}